

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msvc_nmake.cpp
# Opt level: O3

void __thiscall
NmakeMakefileGenerator::writeResponseFileFiles
          (NmakeMakefileGenerator *this,QTextStream *t,ProStringList *files)

{
  long lVar1;
  int iVar2;
  int iVar3;
  ProString *file;
  ProString *path;
  long in_FS_OFFSET;
  ProString escapedFilePath;
  undefined1 local_68 [28];
  int iStack_4c;
  undefined1 *local_48;
  undefined1 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = (files->super_QList<ProString>).d.size;
  if (lVar1 != 0) {
    path = (files->super_QList<ProString>).d.ptr;
    lVar1 = lVar1 * 0x30;
    iVar3 = 0;
    do {
      local_48 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
      local_68._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
      stack0xffffffffffffffb0 = &DAT_aaaaaaaaaaaaaaaa;
      local_68._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_68._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      MakefileGenerator::escapeFilePath((ProString *)local_68,(MakefileGenerator *)this,path);
      iVar2 = 0;
      if (iVar3 != 0) {
        if (iStack_4c + iVar3 < 0x3e9) {
          QTextStream::operator<<(t,' ');
          iVar2 = iVar3 + 1;
        }
        else {
          QTextStream::operator<<(t,'\n');
          iVar2 = 0;
        }
      }
      operator<<(t,(ProString *)local_68);
      iVar3 = iVar2 + iStack_4c;
      if ((QArrayData *)local_68._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_68._0_8_,2,0x10);
        }
      }
      path = path + 1;
      lVar1 = lVar1 + -0x30;
    } while (lVar1 != 0);
  }
  QTextStream::operator<<(t,'\n');
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void NmakeMakefileGenerator::writeResponseFileFiles(QTextStream &t, const ProStringList &files)
{
    // Add line breaks in file lists in reponse files to work around LNK1170.
    // The actual line length limit is 131070, but let's use a smaller limit
    // in case other tools are similarly hampered.
    const int maxLineLength = 1000;
    int len = 0;
    for (const ProString &file : files) {
        const ProString escapedFilePath = escapeFilePath(file);
        if (len) {
            if (len + escapedFilePath.length() > maxLineLength) {
                t << '\n';
                len = 0;
            } else {
                t << ' ';
                len++;
            }
        }
        t << escapedFilePath;
        len += escapedFilePath.length();
    }
    t << '\n';
}